

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O3

void __thiscall
cmake::AppendGlobalGeneratorsDocumentation
          (cmake *this,vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_> *v)

{
  pointer puVar1;
  pointer pcVar2;
  bool bVar3;
  int iVar4;
  bool bVar5;
  pointer puVar6;
  basic_string_view<char,_std::char_traits<char>_> __str;
  string defaultName;
  long *local_a0;
  size_type local_98;
  long local_90 [2];
  cmDocumentationEntry local_80;
  pointer local_38;
  
  EvaluateDefaultGlobalGenerator((cmake *)&stack0xffffffffffffffc8);
  (*(code *)(local_38->_M_t).
            super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
            .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[3].
            _vptr_cmGlobalGeneratorFactory)(&local_a0);
  puVar6 = (this->Generators).
           super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar1 = (this->Generators).
           super__Vector_base<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>,_std::allocator<std::unique_ptr<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (puVar6 != puVar1) {
    bVar5 = false;
    do {
      (*((puVar6->_M_t).
         super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
         ._M_t.
         super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
         .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl)->
        _vptr_cmGlobalGeneratorFactory[3])(&local_80);
      std::vector<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>::
      emplace_back<cmDocumentationEntry>(v,&local_80);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.Brief._M_dataplus._M_p != &local_80.Brief.field_2) {
        operator_delete(local_80.Brief._M_dataplus._M_p,
                        local_80.Brief.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_80.Name._M_dataplus._M_p != &local_80.Name.field_2) {
        operator_delete(local_80.Name._M_dataplus._M_p,
                        local_80.Name.field_2._M_allocated_capacity + 1);
      }
      bVar3 = !bVar5;
      bVar5 = true;
      if (bVar3) {
        pcVar2 = (v->super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        local_80.Name._M_string_length = (size_type)pcVar2[-1].Name._M_dataplus._M_p;
        local_80.Name._M_dataplus._M_p = (pointer)pcVar2[-1].Name._M_string_length;
        __str._M_str = (char *)local_a0;
        __str._M_len = local_98;
        iVar4 = std::basic_string_view<char,_std::char_traits<char>_>::compare
                          ((basic_string_view<char,_std::char_traits<char>_> *)&local_80,0,local_98,
                           __str);
        if (iVar4 == 0) {
          (v->super__Vector_base<cmDocumentationEntry,_std::allocator<cmDocumentationEntry>_>).
          _M_impl.super__Vector_impl_data._M_finish[-1].CustomNamePrefix = '*';
        }
        else {
          bVar5 = false;
        }
      }
      puVar6 = puVar6 + 1;
    } while (puVar6 != puVar1);
  }
  if (local_a0 != local_90) {
    operator_delete(local_a0,local_90[0] + 1);
  }
  (*(code *)(local_38->_M_t).
            super___uniq_ptr_impl<cmGlobalGeneratorFactory,_std::default_delete<cmGlobalGeneratorFactory>_>
            ._M_t.
            super__Tuple_impl<0UL,_cmGlobalGeneratorFactory_*,_std::default_delete<cmGlobalGeneratorFactory>_>
            .super__Head_base<0UL,_cmGlobalGeneratorFactory_*,_false>._M_head_impl[1].
            _vptr_cmGlobalGeneratorFactory)();
  return;
}

Assistant:

void cmake::AppendGlobalGeneratorsDocumentation(
  std::vector<cmDocumentationEntry>& v)
{
  const auto defaultGenerator = this->EvaluateDefaultGlobalGenerator();
  const auto defaultName = defaultGenerator->GetName();
  auto foundDefaultOne = false;

  for (const auto& g : this->Generators) {
    v.emplace_back(g->GetDocumentation());
    if (!foundDefaultOne && cmHasPrefix(v.back().Name, defaultName)) {
      v.back().CustomNamePrefix = '*';
      foundDefaultOne = true;
    }
  }
}